

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O0

int AF_AActor_DamageMobj
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *target;
  AActor *inflictor_00;
  int flags_00;
  int damage_00;
  AActor *source_00;
  VMValue *pVVar1;
  bool bVar2;
  bool local_81;
  bool local_7e;
  bool local_7b;
  TAngle<double> local_78;
  FName local_70;
  int local_6c;
  double dStack_68;
  int u;
  double angle;
  FName local_58;
  int flags;
  FName mod;
  int damage;
  AActor *source;
  AActor *inflictor;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x630,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x630,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  target = (AActor *)(param->field_0).field_1.a;
  local_7b = true;
  if (target != (AActor *)0x0) {
    local_7b = DObject::IsKindOf((DObject *)target,AActor::RegistrationInfo.MyClass);
  }
  if (local_7b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x630,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x631,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar2 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
    bVar2 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar2) {
    inflictor_00 = (AActor *)param[1].field_0.field_1.a;
    local_7e = true;
    if (inflictor_00 != (AActor *)0x0) {
      local_7e = DObject::IsKindOf((DObject *)inflictor_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_7e == false) {
      __assert_fail("inflictor == NULL || inflictor->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                    ,0x631,
                    "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                    ,0x632,
                    "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    bVar2 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[2].field_0.field_1.atag != 1)) {
      bVar2 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (bVar2) {
      _mod = (AActor *)param[2].field_0.field_1.a;
      local_81 = true;
      if (_mod != (AActor *)0x0) {
        local_81 = DObject::IsKindOf((DObject *)_mod,AActor::RegistrationInfo.MyClass);
      }
      if (local_81 == false) {
        __assert_fail("source == NULL || source->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                      ,0x632,
                      "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (numparam < 4) {
        __assert_fail("(paramnum) < numparam",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                      ,0x633,
                      "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (param[3].field_0.field_3.Type != '\0') {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                      ,0x633,
                      "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      flags = param[3].field_0.i;
      if (numparam < 5) {
        __assert_fail("(paramnum) < numparam",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                      ,0x634,
                      "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (param[4].field_0.field_3.Type != '\0') {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                      ,0x634,
                      "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      FName::FName(&local_58,param[4].field_0.i);
      if (numparam < 6) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
        if ((pVVar1->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                        ,0x635,
                        "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
        angle._4_4_ = (pVVar1->field_0).i;
      }
      else {
        if (param[5].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                        ,0x635,
                        "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        angle._4_4_ = param[5].field_0.i;
      }
      if (numparam < 7) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                        ,0x636,
                        "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
        dStack_68 = (pVVar1->field_0).f;
      }
      else {
        if (param[6].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                        ,0x636,
                        "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        dStack_68 = param[6].field_0.f;
      }
      source_00 = _mod;
      damage_00 = flags;
      FName::FName(&local_70,&local_58);
      flags_00 = angle._4_4_;
      TAngle<double>::TAngle(&local_78,dStack_68);
      local_6c = P_DamageMobj(target,inflictor_00,source_00,damage_00,&local_70,flags_00,&local_78);
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                        ,0x637,
                        "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,local_6c);
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x632,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                ,0x631,
                "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, DamageMobj)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(inflictor, AActor);
	PARAM_OBJECT(source, AActor);
	PARAM_INT(damage);
	PARAM_NAME(mod);
	PARAM_INT_DEF(flags);
	PARAM_FLOAT_DEF(angle);
	ACTION_RETURN_INT(P_DamageMobj(self, inflictor, source, damage, mod, flags, angle));
}